

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall TimerHeap::handleTimeout(TimerHeap *this)

{
  __shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  ssize_t sVar3;
  Logger local_1048;
  undefined1 local_68 [8];
  timespec tv;
  uint64_t one;
  timeType_ now;
  TimerPtr tnow;
  
  sVar3 = read(this->timerfd_,&tv.tv_nsec,8);
  if (sVar3 != 8) {
    Logger::Logger(&local_1048,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                   ,0x77);
    LogStream::operator<<((LogStream *)&local_1048,"Timeout Error");
    Logger::~Logger(&local_1048);
  }
  clock_gettime(1,(timespec *)local_68);
  one = (uint64_t)local_68;
  now.sec = tv.tv_sec / 1000000;
  do {
    p_Var1 = &((this->timerHeap_).
               super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>;
    if (p_Var1 == &((this->timerHeap_).
                    super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>) {
LAB_0011124f:
      local_1048.impl_.stream_._0_8_ = 0;
      local_1048.impl_.stream_.buffer_.data_[0] = '\0';
      local_1048.impl_.stream_.buffer_.data_[1] = '\0';
      local_1048.impl_.stream_.buffer_.data_[2] = '\0';
      local_1048.impl_.stream_.buffer_.data_[3] = '\0';
      local_1048.impl_.stream_.buffer_.data_[4] = '\0';
      local_1048.impl_.stream_.buffer_.data_[5] = '\0';
      local_1048.impl_.stream_.buffer_.data_[6] = '\0';
      local_1048.impl_.stream_.buffer_.data_[7] = '\0';
      setTime(this,(timeType_ *)&one,(timeType_ *)&local_1048);
      return;
    }
    std::__shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2> *)&now.msec,p_Var1);
    if (*(int *)(now.msec + 0x30) == -1) {
LAB_00111226:
      pop(this,0);
    }
    else {
      local_1048.impl_.stream_._0_8_ = *(undefined8 *)now.msec;
      local_1048.impl_.stream_.buffer_.data_._0_8_ = *(long *)(now.msec + 8);
      bVar2 = Timer::timeType_::operator>=((timeType_ *)&one,(timeType_ *)&local_1048);
      if (!bVar2) {
        local_1048.impl_.stream_._0_8_ = *(undefined8 *)now.msec;
        local_1048.impl_.stream_.buffer_.data_._0_8_ = *(long *)(now.msec + 8);
        bVar2 = setTime(this,(timeType_ *)&one,(timeType_ *)&local_1048);
        if (!bVar2) goto LAB_00111226;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tnow);
        if ((this->timerHeap_).
            super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (this->timerHeap_).
            super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          return;
        }
        goto LAB_0011124f;
      }
      pop(this,0);
      Logger::Logger(&local_1048,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                     ,0x83);
      LogStream::operator<<((LogStream *)&local_1048,"Connection Timeout!");
      Logger::~Logger(&local_1048);
      Timer::runCallBack((Timer *)now.msec);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tnow);
  } while( true );
}

Assistant:

void TimerHeap::handleTimeout() {
    uint64_t one;
    ssize_t size = read(timerfd_, &one, sizeof one);
    if (size != sizeof(uint64_t)) {
        LOG << "Timeout Error";
    }
    struct timespec tv;
    clock_gettime(CLOCK_MONOTONIC, &tv);
    Timer::timeType_ now = {tv.tv_sec, tv.tv_nsec / 1000 / 1000};
    while (!timerHeap_.empty()) {
        TimerPtr tnow = timerHeap_.front();
        if (tnow->isDeleted()) {
            pop(0);
//            LOG <<"delete";
        } else if (now >= tnow->getTimeout()) {
            pop(0);
            LOG << "Connection Timeout!";
            tnow->runCallBack();
        } else {
            if (setTime(now, tnow->getTimeout())) {
                break;
            } else {
                pop(0);
            }
        }
    }
    if (timerHeap_.empty()) setTime(now, {0, 0});
}